

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall
QAbstractSocketPrivate::startConnectingByName(QAbstractSocketPrivate *this,QString *host)

{
  long lVar1;
  bool bVar2;
  SocketState SVar3;
  QAbstractSocketPrivate *this_00;
  ulong uVar4;
  undefined8 in_RSI;
  QAbstractSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractSocket *q;
  SocketState in_stack_ffffffffffffffbc;
  QAbstractSocketPrivate *pQVar5;
  QAbstractSocketPrivate *in_stack_ffffffffffffffe0;
  NetworkLayerProtocol protocol;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  this_00 = (QAbstractSocketPrivate *)q_func(in_RDI);
  protocol = (NetworkLayerProtocol)((ulong)pQVar5 >> 0x20);
  if ((in_RDI->state == ConnectingState) || (in_RDI->state == ConnectedState)) goto LAB_00250bed;
  in_RDI->state = ConnectingState;
  QAbstractSocket::stateChanged((QAbstractSocket *)0x250af7,in_stack_ffffffffffffffbc);
  if ((in_RDI->cachedSocketDescriptor != -1) ||
     (bVar2 = initSocketLayer(in_stack_ffffffffffffffe0,protocol), bVar2)) {
    uVar4 = (**(code **)(*(long *)in_RDI->socketEngine + 0x88))
                      (in_RDI->socketEngine,in_RSI,in_RDI->port);
    if ((uVar4 & 1) != 0) {
      fetchConnectionParameters(this_00);
      goto LAB_00250bed;
    }
    SVar3 = QAbstractSocketEngine::state((QAbstractSocketEngine *)0x250b68);
    if (SVar3 == ConnectingState) goto LAB_00250bed;
    in_stack_ffffffffffffffbc = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x250b80);
    QAbstractSocketEngine::errorString((QAbstractSocketEngine *)this_00);
    setError(in_RDI,in_stack_ffffffffffffffbc,(QString *)0x250baf);
    QString::~QString((QString *)0x250bb9);
  }
  in_RDI->state = UnconnectedState;
  QAbstractSocket::errorOccurred((QAbstractSocket *)0x250bd8,in_stack_ffffffffffffffbc);
  QAbstractSocket::stateChanged((QAbstractSocket *)0x250bed,in_stack_ffffffffffffffbc);
LAB_00250bed:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSocketPrivate::startConnectingByName(const QString &host)
{
    Q_Q(QAbstractSocket);
    if (state == QAbstractSocket::ConnectingState || state == QAbstractSocket::ConnectedState)
        return;

#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::startConnectingByName(host == %s)", qPrintable(host));
#endif

    // ### Let the socket engine drive this?
    state = QAbstractSocket::ConnectingState;
    emit q->stateChanged(state);

    if (cachedSocketDescriptor != -1 || initSocketLayer(QAbstractSocket::UnknownNetworkLayerProtocol)) {
        // Try to connect to the host. If it succeeds immediately
        // (e.g. QSocks5SocketEngine in UDPASSOCIATE mode), emit
        // connected() and return.
        if (socketEngine->connectToHostByName(host, port)) {
            fetchConnectionParameters();
            return;
        }

        if (socketEngine->state() == QAbstractSocket::ConnectingState)
            return;

        // failed to connect
        setError(socketEngine->error(), socketEngine->errorString());
    }

    state = QAbstractSocket::UnconnectedState;
    emit q->errorOccurred(socketError);
    emit q->stateChanged(state);
}